

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

_Bool ts_parser__do_all_potential_reductions
                (TSParser *self,StackVersion starting_version,TSSymbol lookahead_symbol)

{
  ReduceAction *pRVar1;
  byte bVar2;
  TSStateId state;
  short sVar3;
  ushort uVar4;
  uint uVar5;
  uint uVar6;
  _Bool _Var7;
  uint32_t uVar8;
  Stack *pSVar9;
  ReduceAction *pRVar10;
  ushort uVar11;
  uint uVar12;
  ulong uVar13;
  byte bVar14;
  StackVersion version2;
  uint uVar15;
  long lVar16;
  StackVersion SVar17;
  ulong uVar18;
  TSSymbol symbol;
  uint uVar19;
  ulong uVar20;
  byte bVar21;
  bool bVar22;
  TableEntry entry;
  _Bool local_90;
  TableEntry local_40;
  
  pSVar9 = self->stack;
  uVar5 = (pSVar9->heads).size;
  uVar19 = 0;
  local_90 = false;
  if (starting_version < uVar5) {
    local_90 = false;
    uVar12 = uVar5;
    version2 = starting_version;
    do {
      SVar17 = uVar5;
      if (uVar5 < version2) {
        do {
          _Var7 = ts_stack_merge(self->stack,SVar17,version2);
          if (_Var7) goto LAB_00139951;
          SVar17 = SVar17 + 1;
        } while (version2 != SVar17);
        pSVar9 = self->stack;
      }
      if ((pSVar9->heads).size <= version2) {
LAB_0013998d:
        __assert_fail("(uint32_t)version < (&self->heads)->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                      ,0x198,"TSStateId ts_stack_state(const Stack *, StackVersion)");
      }
      state = ((pSVar9->heads).contents[version2].node)->state;
      (self->reduce_actions).size = 0;
      uVar11 = lookahead_symbol + 1;
      symbol = lookahead_symbol;
      if (lookahead_symbol == 0) {
        uVar11 = (ushort)self->language->token_count;
        symbol = 1;
      }
      if (symbol < uVar11) {
        bVar21 = 0;
        do {
          ts_language_table_entry(self->language,state,symbol,&local_40);
          if (local_40.action_count != 0) {
            uVar20 = 0;
            uVar8 = local_40.action_count;
            do {
              sVar3 = local_40.actions[uVar20].params.field_1.dynamic_precedence;
              bVar14 = local_40.actions[uVar20].field_0x6 & 0xf;
              if (bVar14 == 3) {
LAB_001396d5:
                bVar21 = bVar21 | ((long)sVar3 & 2U) == 0 & ((byte)sVar3 ^ 1);
              }
              else if (bVar14 == 1) {
                bVar14 = local_40.actions[uVar20].params.field_1.child_count;
                if ((ulong)bVar14 != 0) {
                  uVar4 = local_40.actions[uVar20].params.field_0.state;
                  bVar2 = local_40.actions[uVar20].params.field_1.alias_sequence_id;
                  uVar15 = (self->reduce_actions).size;
                  if ((ulong)uVar15 != 0) {
                    pRVar10 = (self->reduce_actions).contents;
                    lVar16 = 0;
                    do {
                      if ((*(ushort *)((long)&pRVar10->symbol + lVar16) == uVar4) &&
                         (*(uint *)((long)&pRVar10->count + lVar16) == (uint)bVar14))
                      goto LAB_001396e7;
                      lVar16 = lVar16 + 0x10;
                    } while ((ulong)uVar15 << 4 != lVar16);
                  }
                  if (uVar15 == (self->reduce_actions).capacity) {
                    uVar6 = uVar15 * 2;
                    if (uVar15 * 2 < 9) {
                      uVar6 = 8;
                    }
                    pRVar10 = (self->reduce_actions).contents;
                    if (uVar15 < uVar6) {
                      if (pRVar10 == (ReduceAction *)0x0) {
                        pRVar10 = (ReduceAction *)calloc((ulong)uVar6,0x10);
                        if (pRVar10 == (ReduceAction *)0x0) goto LAB_00139983;
                      }
                      else {
                        pRVar10 = (ReduceAction *)realloc(pRVar10,(ulong)uVar6 << 4);
                        if (pRVar10 == (ReduceAction *)0x0) {
                          ts_parser__do_all_potential_reductions_cold_1();
LAB_00139983:
                          ts_parser__do_all_potential_reductions_cold_2();
                          goto LAB_0013998d;
                        }
                        uVar15 = (self->reduce_actions).size;
                      }
                      (self->reduce_actions).contents = pRVar10;
                      (self->reduce_actions).capacity = uVar6;
                    }
                  }
                  else {
                    pRVar10 = (self->reduce_actions).contents;
                  }
                  uVar18 = (ulong)uVar4 << 0x20 | (ulong)bVar14;
                  uVar13 = (long)sVar3 & 0xffffffffU | (ulong)bVar2 << 0x20;
                  (self->reduce_actions).size = uVar15 + 1;
                  pRVar1 = pRVar10 + uVar15;
                  pRVar1->count = (int)uVar18;
                  pRVar1->symbol = (short)(uVar18 >> 0x20);
                  *(short *)&pRVar1->field_0x6 = (short)(uVar18 >> 0x30);
                  pRVar10 = pRVar10 + uVar15;
                  pRVar10->dynamic_precedence = (int)uVar13;
                  pRVar10->alias_sequence_id = (short)(uVar13 >> 0x20);
                  *(short *)&pRVar10->field_0xe = (short)(uVar13 >> 0x30);
                  uVar8 = local_40.action_count;
                }
              }
              else if ((local_40.actions[uVar20].field_0x6 & 0xf) == 0) goto LAB_001396d5;
LAB_001396e7:
              uVar20 = uVar20 + 1;
            } while (uVar20 < uVar8);
          }
          uVar20 = 0;
          symbol = symbol + 1;
        } while (symbol != uVar11);
        if ((self->reduce_actions).size == 0) {
          SVar17 = 0xffffffff;
        }
        else {
          lVar16 = 0xc;
          do {
            pRVar10 = (self->reduce_actions).contents;
            SVar17 = ts_parser__reduce(self,version2,*(TSSymbol *)((long)pRVar10 + lVar16 + -8),
                                       *(uint32_t *)((long)pRVar10 + lVar16 + -0xc),
                                       *(int *)((long)pRVar10 + lVar16 + -4),
                                       *(uint16_t *)((long)&pRVar10->count + lVar16),true);
            uVar20 = uVar20 + 1;
            lVar16 = lVar16 + 0x10;
          } while (uVar20 < (self->reduce_actions).size);
        }
        _Var7 = true;
        if (bVar21 != 0) goto LAB_0013993e;
        if (5 < uVar19 || SVar17 == 0xffffffff) goto LAB_00139915;
        ts_stack_renumber_version(self->stack,SVar17,version2);
      }
      else {
LAB_00139915:
        _Var7 = local_90;
        if (lookahead_symbol != 0) {
          ts_stack_remove_version(self->stack,version2);
        }
LAB_0013993e:
        local_90 = _Var7;
        bVar22 = version2 == starting_version;
        version2 = version2 + 1;
        if (bVar22) {
          version2 = uVar12;
        }
      }
LAB_00139951:
      uVar19 = uVar19 + 1;
      pSVar9 = self->stack;
      uVar12 = (pSVar9->heads).size;
    } while (version2 < uVar12);
  }
  return local_90;
}

Assistant:

static bool ts_parser__do_all_potential_reductions(TSParser *self,
                                                   StackVersion starting_version,
                                                   TSSymbol lookahead_symbol) {
  uint32_t initial_version_count = ts_stack_version_count(self->stack);

  bool can_shift_lookahead_symbol = false;
  StackVersion version = starting_version;
  for (unsigned i = 0; true; i++) {
    uint32_t version_count = ts_stack_version_count(self->stack);
    if (version >= version_count) break;

    bool merged = false;
    for (StackVersion i = initial_version_count; i < version; i++) {
      if (ts_stack_merge(self->stack, i, version)) {
        merged = true;
        break;
      }
    }
    if (merged) continue;

    TSStateId state = ts_stack_state(self->stack, version);
    bool has_shift_action = false;
    array_clear(&self->reduce_actions);

    TSSymbol first_symbol, end_symbol;
    if (lookahead_symbol != 0) {
      first_symbol = lookahead_symbol;
      end_symbol = lookahead_symbol + 1;
    } else {
      first_symbol = 1;
      end_symbol = self->language->token_count;
    }

    for (TSSymbol symbol = first_symbol; symbol < end_symbol; symbol++) {
      TableEntry entry;
      ts_language_table_entry(self->language, state, symbol, &entry);
      for (uint32_t i = 0; i < entry.action_count; i++) {
        TSParseAction action = entry.actions[i];
        switch (action.type) {
          case TSParseActionTypeShift:
          case TSParseActionTypeRecover:
            if (!action.params.extra && !action.params.repetition) has_shift_action = true;
            break;
          case TSParseActionTypeReduce:
            if (action.params.child_count > 0)
              ts_reduce_action_set_add(&self->reduce_actions, (ReduceAction){
                .symbol = action.params.symbol,
                .count = action.params.child_count,
                .dynamic_precedence = action.params.dynamic_precedence,
                .alias_sequence_id = action.params.alias_sequence_id,
              });
          default:
            break;
        }
      }
    }

    StackVersion reduction_version = STACK_VERSION_NONE;
    for (uint32_t i = 0; i < self->reduce_actions.size; i++) {
      ReduceAction action = self->reduce_actions.contents[i];

      reduction_version = ts_parser__reduce(
        self, version, action.symbol, action.count,
        action.dynamic_precedence, action.alias_sequence_id,
        true
      );
    }

    if (has_shift_action) {
      can_shift_lookahead_symbol = true;
    } else if (reduction_version != STACK_VERSION_NONE && i < MAX_VERSION_COUNT) {
      ts_stack_renumber_version(self->stack, reduction_version, version);
      continue;
    } else if (lookahead_symbol != 0) {
      ts_stack_remove_version(self->stack, version);
    }

    if (version == starting_version) {
      version = version_count;
    } else {
      version++;
    }
  }

  return can_shift_lookahead_symbol;
}